

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_IXOR_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  if (instr->src == bVar1) {
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\txor ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    poVar2 = std::operator<<(poVar2,", qword ptr [");
    poVar2 = std::operator<<(poVar2,"rsi");
    poVar2 = std::operator<<(poVar2,"+");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,instr->imm32 & 0x1ffff8);
    pcVar3 = "]";
  }
  else {
    genAddressReg(this,instr,"eax");
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\txor ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    poVar2 = std::operator<<(poVar2,", qword ptr [");
    poVar2 = std::operator<<(poVar2,"rsi");
    pcVar3 = "+rax]";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IXOR_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr);
			asmCode << "\txor " << regR[instr.dst] << ", qword ptr [" << regScratchpadAddr << "+rax]" << std::endl;
		}
		else {
			asmCode << "\txor " << regR[instr.dst] << ", qword ptr [" << regScratchpadAddr << "+" << genAddressImm(instr) << "]" << std::endl;
		}
		traceint(instr);
	}